

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void Destroy_SuperNode_Matrix(SuperMatrix *A)

{
  superlu_free(*(void **)((long)A->Store + 0x18));
  superlu_free(*(void **)((long)A->Store + 0x20));
  superlu_free(*(void **)((long)A->Store + 8));
  superlu_free(*(void **)((long)A->Store + 0x10));
  superlu_free(*(void **)((long)A->Store + 0x28));
  superlu_free(*(void **)((long)A->Store + 0x30));
  superlu_free(A->Store);
  return;
}

Assistant:

void
Destroy_SuperNode_Matrix(SuperMatrix *A)
{
    SUPERLU_FREE ( ((SCformat *)A->Store)->rowind );
    SUPERLU_FREE ( ((SCformat *)A->Store)->rowind_colptr );
    SUPERLU_FREE ( ((SCformat *)A->Store)->nzval );
    SUPERLU_FREE ( ((SCformat *)A->Store)->nzval_colptr );
    SUPERLU_FREE ( ((SCformat *)A->Store)->col_to_sup );
    SUPERLU_FREE ( ((SCformat *)A->Store)->sup_to_col );
    SUPERLU_FREE ( A->Store );
}